

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_PlaneEquation *
ON_PlaneEquation::CreateFromThreePoints(ON_3dPoint pointA,ON_3dPoint pointB,ON_3dPoint pointC)

{
  ON_3dVector A;
  ON_3dPoint point;
  ON_3dVector B;
  ON_3dVector normal;
  undefined1 auVar1 [16];
  ON_3dPoint OVar2;
  bool bVar3;
  ON_PlaneEquation *in_RDI;
  double in_stack_ffffffffffffff38;
  double local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_38 [8];
  ON_3dVector Y;
  ON_3dVector X;
  
  bVar3 = ON_3dPoint::IsValid((ON_3dPoint *)&stack0x00000008);
  if (((bVar3) && (bVar3 = ON_3dPoint::IsValid((ON_3dPoint *)&pointA.z), bVar3)) &&
     (bVar3 = ON_3dPoint::IsValid((ON_3dPoint *)&pointB.z), bVar3)) {
    ON_3dPoint::operator-
              ((ON_3dVector *)&Y.z,(ON_3dPoint *)&pointA.z,(ON_3dPoint *)&stack0x00000008);
    ON_3dPoint::operator-
              ((ON_3dVector *)local_38,(ON_3dPoint *)&pointB.z,(ON_3dPoint *)&stack0x00000008);
    auVar1 = (undefined1  [16])pointA._0_16_;
    A.y = X.y;
    A.x = X.x;
    A.z = (double)local_38;
    B.y = Y.y;
    B.x = Y.x;
    B.z = in_stack_ffffffffffffff38;
    ON_3dVector::CrossProduct(A,B);
    OVar2 = pointA;
    point.z = local_68;
    pointA.x = auVar1._0_8_;
    pointA.y = auVar1._8_8_;
    point.x = pointA.x;
    point.y = pointA.y;
    normal.y = (double)local_58;
    normal.x = (double)local_60;
    normal.z = in_stack_ffffffffffffff38;
    pointA = OVar2;
    CreateFromPointAndNormal(point,normal);
  }
  else {
    in_RDI->x = NanPlaneEquation.x;
    in_RDI->y = NanPlaneEquation.y;
    in_RDI->z = NanPlaneEquation.z;
    in_RDI->d = NanPlaneEquation.d;
  }
  return in_RDI;
}

Assistant:

const ON_PlaneEquation ON_PlaneEquation::CreateFromThreePoints(
  ON_3dPoint pointA,
  ON_3dPoint pointB,
  ON_3dPoint pointC
)
{
  if (pointA.IsValid() && pointB.IsValid() && pointC.IsValid())
  {
    const ON_3dVector X = pointB - pointA;
    const ON_3dVector Y = pointC - pointA;
    return ON_PlaneEquation::CreateFromPointAndNormal(pointA, ON_3dVector::CrossProduct(X, Y));
  }
  return ON_PlaneEquation::NanPlaneEquation;
}